

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEAngle.cpp
# Opt level: O0

bool __thiscall test_CEAngle::test_setangle(test_CEAngle *this)

{
  initializer_list<double> __l;
  byte bVar1;
  long *in_RDI;
  invalid_value *e_2;
  invalid_value *e_1;
  invalid_delimiter *e;
  string angle_dms_str1;
  string angle_hms_str3;
  string angle_hms_str2;
  string angle_hms_str1;
  string angle_deg_str;
  double angle_deg;
  double angle_rad;
  CEAngle test_ang;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb50;
  allocator *paVar2;
  allocator *__a;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb70;
  allocator *paVar3;
  allocator *paVar4;
  CEAngleType *in_stack_fffffffffffffbb0;
  CEAngleType *angle_type;
  double *in_stack_fffffffffffffbb8;
  CEAngle *in_stack_fffffffffffffbc0;
  CEAngle *this_00;
  undefined4 local_3b8;
  allocator local_3b1;
  string local_3b0 [32];
  undefined4 local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 *local_368;
  undefined8 local_360;
  undefined4 local_310;
  allocator local_309;
  string local_308 [36];
  undefined4 local_2e4;
  undefined8 local_2e0;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  CEAngleType *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  CEAngle *in_stack_fffffffffffffd70;
  undefined4 local_278;
  allocator local_271;
  string local_270 [32];
  undefined8 local_250;
  double local_248;
  undefined1 local_239;
  undefined4 local_238;
  allocator local_231;
  string local_230 [32];
  undefined4 local_210;
  allocator local_209;
  string local_208 [32];
  undefined8 local_1e8;
  double local_1e0;
  undefined1 local_1d5;
  undefined4 local_1d4;
  undefined4 local_1d0;
  allocator local_1c9;
  string local_1c8 [32];
  undefined8 local_1a8;
  CEAngleType *local_1a0;
  undefined1 local_195;
  undefined4 local_194;
  undefined4 local_190;
  allocator local_189;
  string local_188 [32];
  undefined8 local_168;
  CEAngle *local_160;
  undefined1 local_151;
  undefined4 local_150;
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [35];
  undefined1 local_d5;
  undefined4 local_d4;
  undefined4 local_d0;
  allocator local_c9;
  string local_c8 [32];
  undefined8 local_a8;
  double local_a0;
  undefined4 local_98;
  allocator local_91;
  string local_90 [32];
  undefined8 local_70;
  undefined4 local_68;
  allocator local_61;
  string local_60 [32];
  double local_40 [3];
  undefined4 local_24;
  undefined8 local_20;
  CEAngle local_18;
  
  CEAngle::CEAngle((CEAngle *)0x11d804);
  local_20 = 0x3ff921fb54442d18;
  local_24 = 1;
  CEAngle::SetAngle(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  local_40[0] = CEAngle::operator_cast_to_double(&local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"test_setangle",&local_61);
  local_68 = 0x6f;
  (**(code **)(*in_RDI + 0x58))(in_RDI,local_40,&local_20,local_60,&local_68);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_70 = 0x4066800000000000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"180.0",&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_98 = 0;
  CEAngle::SetAngle(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  local_a0 = CEAngle::operator_cast_to_double(&local_18);
  local_a8 = 0x400921fb54442d18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"test_setangle",&local_c9);
  local_d0 = 0x75;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_a0,&local_a8,local_c8,&local_d0);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::c_str();
  local_d4 = 0;
  local_d5 = 0;
  CEAngle::SetAngle(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                    (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"3:0:0",&local_f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"6 0 0",&local_121);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"9.0.0",&local_149);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::__cxx11::string::c_str();
  local_150 = 2;
  local_151 = 0;
  CEAngle::SetAngle(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                    (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  this_00 = (CEAngle *)CEAngle::operator_cast_to_double(&local_18);
  local_168 = 0x3fe921fb54442d18;
  paVar2 = &local_189;
  local_160 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"test_setangle",paVar2);
  local_190 = 0x7d;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_160,&local_168,local_188,&local_190);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::c_str();
  local_194 = 2;
  local_195 = 0;
  CEAngle::SetAngle(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                    (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  angle_type = (CEAngleType *)CEAngle::operator_cast_to_double(&local_18);
  local_1a8 = 0x3ff921fb54442d18;
  local_1a0 = angle_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"test_setangle",&local_1c9);
  local_1d0 = 0x7f;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_1a0,&local_1a8,local_1c8,&local_1d0);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::__cxx11::string::c_str();
  local_1d4 = 2;
  local_1d5 = 0x2e;
  CEAngle::SetAngle(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                    (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  local_1e0 = CEAngle::operator_cast_to_double(&local_18);
  local_1e8 = 0x4002d97c7f3321d2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"test_setangle",&local_209);
  local_210 = 0x81;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_1e0,&local_1e8,local_208,&local_210);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"45:0:0",&local_231);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::string::c_str();
  local_238 = 3;
  local_239 = 0;
  CEAngle::SetAngle(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                    (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  local_248 = CEAngle::operator_cast_to_double(&local_18);
  local_250 = 0x3fe921fb54442d18;
  paVar4 = &local_271;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"test_setangle",paVar4);
  local_278 = 0x86;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_248,&local_250,local_270,&local_278);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::c_str();
  CEAngle::SetAngle(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                    (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  paVar3 = (allocator *)&stack0xfffffffffffffd5f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffd60,"test_setangle",paVar3);
  (**(code **)(*in_RDI + 0x48))(in_RDI,0,&stack0xfffffffffffffd60,&stack0xfffffffffffffd58);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd5f);
  local_2e0 = 0x405edd2f1a9fbe77;
  local_2e4 = 2;
  CEAngle::SetAngle(this_00,(double *)paVar2,angle_type);
  __a = &local_309;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"test_setangle",__a);
  local_310 = 0x93;
  (**(code **)(*in_RDI + 0x48))(in_RDI,0,local_308,&local_310);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  local_378 = 0x4018000000000000;
  uStack_370 = 0x3fe93f7ced916873;
  local_388 = 0x405ec00000000000;
  uStack_380 = 0x4046800000000000;
  local_368 = &local_388;
  local_360 = 4;
  std::allocator<double>::allocator((allocator<double> *)0x11e66a);
  __l._M_len = (size_type)paVar4;
  __l._M_array = (iterator)paVar3;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffb70,__l,(allocator_type *)__a);
  local_390 = 0;
  CEAngle::SetAngle(this_00,(vector<double,_std::allocator<double>_> *)paVar2,angle_type);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffb50);
  std::allocator<double>::~allocator((allocator<double> *)0x11e6d2);
  paVar2 = &local_3b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"test_setangle",paVar2);
  local_3b8 = 0x9b;
  (**(code **)(*in_RDI + 0x48))(in_RDI,0,local_3b0,&local_3b8);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  bVar1 = (**(code **)(*in_RDI + 0x18))();
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_90);
  CEAngle::~CEAngle((CEAngle *)0x11e939);
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CEAngle::test_setangle(void)
{
    // Construct the test angle
    CEAngle test_ang;
    // Test radians
    double angle_rad = M_PI_2;  // PI/2 radians or 90 degrees
    test_ang.SetAngle(angle_rad, CEAngleType::RADIANS);
    test_double(test_ang, angle_rad, __func__, __LINE__);

    // Test degrees
    double angle_deg = 180.0;
    std::string angle_deg_str = "180.0";
    test_ang.SetAngle(angle_deg, CEAngleType::DEGREES);
    test_double(test_ang, M_PI, __func__, __LINE__);
    test_ang.SetAngle(angle_deg_str.c_str(), CEAngleType::DEGREES);

    // HMS values to be tested
    std::string angle_hms_str1 = "3:0:0";
    std::string angle_hms_str2 = "6 0 0";
    std::string angle_hms_str3 = "9.0.0";
    test_ang.SetAngle(angle_hms_str1.c_str(), CEAngleType::HMS);
    test_double(test_ang, M_PI_2/2.0, __func__, __LINE__);
    test_ang.SetAngle(angle_hms_str2.c_str(), CEAngleType::HMS);
    test_double(test_ang, M_PI_2, __func__, __LINE__);
    test_ang.SetAngle(angle_hms_str3.c_str(), CEAngleType::HMS, '.');
    test_double(test_ang, 1.5 * M_PI_2, __func__, __LINE__);

    // DMS values to be tested
    std::string angle_dms_str1 = "45:0:0";
    test_ang.SetAngle(angle_dms_str1.c_str(), CEAngleType::DMS);
    test_double(test_ang, M_PI_2/2.0, __func__, __LINE__);

    // Try to set the angle by passing the wrong delimiter
    try {
        test_ang.SetAngle(angle_hms_str1.c_str(), CEAngleType::HMS, ' ');
        test(false, __func__, __LINE__);
    } catch (CEException::invalid_delimiter& e) {
        test(true, __func__, __LINE__);
    }

    // Try to set angle as a double, but with the wrong CEAngleType
    try {
        test_ang.SetAngle(123.456, CEAngleType::HMS);
        test(false, __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, __func__, __LINE__);
    }

    // Try to set the angle from a vector<double> with wrong CEAngleType
    try {
        test_ang.SetAngle({123,45,6, 0.789}, CEAngleType::DEGREES);
        test(false, __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, __func__, __LINE__);
    }

    return pass();
}